

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CMadd_poll(CManager_conflict cm,CMPollFunc func,void *client_data)

{
  void *in_RDI;
  
  CMControlList_add_poll((CMControlList)cm,(CManager_conflict)func,(CMPollFunc)client_data,in_RDI);
  return;
}

Assistant:

extern
void
INT_CMadd_poll(CManager cm, CMPollFunc func, void *client_data)
{
    CMControlList_add_poll(cm->control_list, cm, func, client_data);
}